

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O3

size_t rcnb_encode(char *plaintext_in,size_t length_in,wchar_t *code_out)

{
  size_t sVar1;
  rcnb_encodestate local_12;
  
  sVar1 = rcnb_encode_block(plaintext_in,length_in,code_out,&local_12);
  code_out[sVar1] = L'\0';
  return sVar1;
}

Assistant:

size_t rcnb_encode(const char* plaintext_in, size_t length_in, wchar_t* code_out)
{
    rcnb_encodestate es;
    rcnb_init_encodestate(&es);
    size_t output_size = 0;
    output_size += rcnb_encode_block(plaintext_in, length_in, code_out, &es);
    output_size += rcnb_encode_blockend(code_out + output_size, &es);
    return output_size;
}